

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * __thiscall Imath_3_2::Matrix44<double>::transposed(Matrix44<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Matrix44<double> *in_RDI;
  
  dVar1 = this->x[1][0];
  dVar2 = this->x[2][0];
  dVar3 = this->x[3][0];
  dVar4 = this->x[0][1];
  dVar5 = this->x[1][1];
  dVar6 = this->x[2][1];
  dVar7 = this->x[3][1];
  dVar8 = this->x[0][2];
  dVar9 = this->x[1][2];
  dVar10 = this->x[2][2];
  dVar11 = this->x[3][2];
  dVar12 = this->x[0][3];
  dVar13 = this->x[1][3];
  dVar14 = this->x[2][3];
  dVar15 = this->x[3][3];
  in_RDI->x[0][0] = this->x[0][0];
  in_RDI->x[0][1] = dVar1;
  in_RDI->x[0][2] = dVar2;
  in_RDI->x[0][3] = dVar3;
  in_RDI->x[1][0] = dVar4;
  in_RDI->x[1][1] = dVar5;
  in_RDI->x[1][2] = dVar6;
  in_RDI->x[1][3] = dVar7;
  in_RDI->x[2][0] = dVar8;
  in_RDI->x[2][1] = dVar9;
  in_RDI->x[2][2] = dVar10;
  in_RDI->x[2][3] = dVar11;
  in_RDI->x[3][0] = dVar12;
  in_RDI->x[3][1] = dVar13;
  in_RDI->x[3][2] = dVar14;
  in_RDI->x[3][3] = dVar15;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix44<T>
Matrix44<T>::transposed () const IMATH_NOEXCEPT
{
    return Matrix44 (
        x[0][0],
        x[1][0],
        x[2][0],
        x[3][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[3][1],
        x[0][2],
        x[1][2],
        x[2][2],
        x[3][2],
        x[0][3],
        x[1][3],
        x[2][3],
        x[3][3]);
}